

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

unsigned_short
duckdb::TryCastCInternal<short,unsigned_short,duckdb::TryCast>
          (duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  short sVar2;
  unsigned_short result_value;
  undefined1 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffc9;
  undefined2 in_stack_ffffffffffffffca;
  undefined4 in_stack_ffffffffffffffcc;
  undefined6 in_stack_ffffffffffffffd0;
  int16_t in_stack_ffffffffffffffd6;
  undefined2 local_22;
  undefined2 local_2;
  
  sVar2 = UnsafeFetch<short>((duckdb_result *)
                             CONCAT26(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0),
                             CONCAT44(in_stack_ffffffffffffffcc,
                                      CONCAT22(in_stack_ffffffffffffffca,
                                               CONCAT11(in_stack_ffffffffffffffc9,
                                                        in_stack_ffffffffffffffc8))),0x1942ff7);
  bVar1 = TryCast::Operation<short,unsigned_short>
                    (in_stack_ffffffffffffffd6,
                     (uint16_t *)
                     CONCAT44(in_stack_ffffffffffffffcc,
                              CONCAT22(sVar2,CONCAT11(in_stack_ffffffffffffffc9,
                                                      in_stack_ffffffffffffffc8))),false);
  if (bVar1) {
    local_2 = local_22;
  }
  else {
    local_2 = FetchDefaultValue::Operation<unsigned_short>();
  }
  return local_2;
}

Assistant:

RESULT_TYPE TryCastCInternal(duckdb_result *result, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!OP::template Operation<SOURCE_TYPE, RESULT_TYPE>(UnsafeFetch<SOURCE_TYPE>(result, col, row),
		                                                      result_value)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}